

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapePiram>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  double dVar1;
  double dVar2;
  pair<int,_long> *ppVar3;
  double *pdVar4;
  long row;
  int d;
  long row_00;
  long col;
  int i;
  long row_01;
  
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (divphi,(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements,1);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (phi,3,(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(phi);
  TPZShapeH1<pzshape::TPZShapePiram>::Shape(pt,data);
  for (row_01 = 0; row_01 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
      row_01 = row_01 + 1) {
    ppVar3 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
    col = (long)ppVar3[row_01].first;
    row = (long)(int)ppVar3[row_01].second;
    pdVar4 = TPZFMatrix<double>::operator()(divphi,row_01,0);
    *pdVar4 = 0.0;
    for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()(&(data->fPhi).super_TPZFMatrix<double>,row,0);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (&(data->fMasterDirections).super_TPZFMatrix<double>,row_00,col);
      dVar2 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(phi,row_00,row_01);
      *pdVar4 = dVar1 * dVar2;
      pdVar4 = TPZFMatrix<double>::operator()(&(data->fDPhi).super_TPZFMatrix<double>,row_00,row);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (&(data->fMasterDirections).super_TPZFMatrix<double>,row_00,col);
      dVar2 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(divphi,row_01,0);
      *pdVar4 = dVar1 * dVar2 + *pdVar4;
    }
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{
    
    divphi.Resize(data.fSDVecShapeIndex.size(),1);
    divphi.Zero();
    phi.Resize(TSHAPE::Dimension,data.fSDVecShapeIndex.size());
    phi.Zero();

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        auto it = data.fSDVecShapeIndex[i];
        int vecindex = it.first;
        int scalindex = it.second;
        divphi(i,0) = 0.;
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
            divphi(i,0) += data.fDPhi(d,scalindex)*data.fMasterDirections(d,vecindex);
        }
    }
}